

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
* __thiscall
deqp::gles2::Performance::anon_unknown_1::BinaryOpCase::generateProgramData
          (vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
           *__return_storage_ptr__,BinaryOpCase *this)

{
  ProgramContext local_98;
  ProgramID local_20;
  undefined1 local_19;
  int i;
  BinaryOpCase *this_local;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  *progData;
  
  local_19 = 0;
  _i = this;
  this_local = (BinaryOpCase *)__return_storage_ptr__;
  std::
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  ::vector(__return_storage_ptr__);
  for (local_20 = PROGRAM_WITH_BIGGER_LOOP; (int)local_20 < 2;
      local_20 = local_20 + PROGRAM_WITH_SMALLER_LOOP) {
    generateSingleProgramData(&local_98,this,local_20);
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
    ::push_back(__return_storage_ptr__,&local_98);
    OperatorPerformanceCase::ProgramContext::~ProgramContext(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<BinaryOpCase::ProgramContext> BinaryOpCase::generateProgramData (void) const
{
	vector<ProgramContext> progData;
	for (int i = 0; i < PROGRAM_LAST; i++)
		progData.push_back(generateSingleProgramData((ProgramID)i));
	return progData;
}